

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int iVar5;
  JSValueUnion JVar6;
  uint32_t *pres;
  JSValueUnion JVar7;
  int64_t iVar8;
  ulong uVar9;
  JSValue this_obj;
  JSValue v;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue prop;
  uint32_t local_5c;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  if ((((int)this_val.tag != -1) || (*(short *)((long)this_val.u.ptr + 6) != 0x25)) ||
     (plVar2 = *(long **)((long)this_val.u.ptr + 0x30), plVar2 == (long *)0x0)) {
    JS_ThrowTypeErrorInvalidClass(ctx,0x25);
    goto LAB_0013a3cd;
  }
  if ((int)plVar2[1] == 3) {
LAB_0013a3b1:
    *pdone = 1;
    uVar9 = 3;
  }
  else {
    JVar7.ptr = (void *)*plVar2;
    if ((ushort)(*(short *)((long)JVar7.ptr + 6) - 0x15U) < 9) {
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar7.ptr + 0x30) + 0x18) + 0x30) + 4) ==
          '\0') {
        pres = (uint32_t *)((long)JVar7.ptr + 0x40);
LAB_0013a44b:
        uVar1 = *(uint *)((long)plVar2 + 0x14);
        JVar7._4_4_ = 0;
        JVar7.int32 = uVar1;
        if (uVar1 < *pres) {
          *(uint *)((long)plVar2 + 0x14) = uVar1 + 1;
          *pdone = 0;
          if ((int)plVar2[2] == 0) {
            JVar6.float64 = (double)JVar7.float64;
            if (-1 < (int)uVar1) {
              JVar6 = JVar7;
            }
            iVar8 = 7;
            if (-1 < (int)uVar1) {
              iVar8 = 0;
            }
            JVar12.tag = iVar8;
            JVar12.u.float64 = JVar6.float64;
            uVar9 = 0x7fffffff00000000;
          }
          else {
            JVar6.float64 = (double)JVar7.float64;
            if (-1 < (int)uVar1) {
              JVar6 = JVar7;
            }
            iVar8 = 7;
            if (-1 < (int)uVar1) {
              iVar8 = 0;
            }
            this_obj.tag = plVar2[1];
            this_obj.u = (JSValueUnion)(void *)*plVar2;
            prop.tag = iVar8;
            prop.u.float64 = JVar6.float64;
            JVar11 = JS_GetPropertyValue(ctx,this_obj,prop);
            JVar6 = JVar11.u;
            uVar9 = 0;
            JVar12 = (JSValue)(ZEXT816(6) << 0x40);
            if ((uint)JVar11.tag == 6) goto LAB_0013a3e0;
            uVar9 = 0xffffffff00000000;
            if ((int)plVar2[2] == 1) {
              uVar9 = (ulong)JVar6.ptr & 0xffffffff00000000;
              JVar12 = JVar11;
              goto LAB_0013a3e0;
            }
            local_58.float64 = (double)JVar7.float64;
            if (-1 < (int)uVar1) {
              local_58 = JVar7;
            }
            local_50 = iVar8;
            local_48 = JVar11;
            JVar12 = js_create_array(ctx,2,(JSValue *)&local_58);
            if ((0xfffffff4 < (uint)JVar11.tag) &&
               (iVar5 = *JVar6.ptr, *(int *)JVar6.ptr = iVar5 + -1, iVar5 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar11);
            }
          }
          uVar9 = uVar9 & (ulong)JVar12.u.ptr;
          goto LAB_0013a3e0;
        }
        lVar3 = plVar2[1];
        if (0xfffffff4 < (uint)lVar3) {
          JVar7.ptr = (void *)*plVar2;
          iVar5 = *JVar7.ptr;
          *(int *)JVar7.ptr = iVar5 + -1;
          if (iVar5 < 2) {
            v.tag = lVar3;
            v.u = (JSValueUnion)(JSValueUnion)JVar7.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
        }
        *(undefined4 *)plVar2 = 0;
        plVar2[1] = 3;
        goto LAB_0013a3b1;
      }
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
    }
    else {
      pres = &local_5c;
      JVar11.tag = plVar2[1];
      JVar11.u.ptr = JVar7.ptr;
      iVar5 = js_get_length32(ctx,pres,JVar11);
      if (iVar5 == 0) goto LAB_0013a44b;
    }
LAB_0013a3cd:
    *pdone = 0;
    uVar9 = 6;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar9 = 0;
  JVar12 = (JSValue)(auVar4 << 0x40);
LAB_0013a3e0:
  JVar10.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar9);
  JVar10.tag = JVar12.tag;
  return JVar10;
}

Assistant:

static JSValue js_array_iterator_next(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv,
                                      BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t len, idx;
    JSValue val, obj;
    JSObject *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_ARRAY_ITERATOR);
    if (!it)
        goto fail1;
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_OBJ(it->obj);
    if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
        p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
        if (typed_array_is_detached(ctx, p)) {
            JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            goto fail1;
        }
        len = p->u.array.count;
    } else {
        if (js_get_length32(ctx, &len, it->obj)) {
        fail1:
            *pdone = FALSE;
            return JS_EXCEPTION;
        }
    }
    idx = it->idx;
    if (idx >= len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }
    it->idx = idx + 1;
    *pdone = FALSE;
    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_NewUint32(ctx, idx);
    } else {
        val = JS_GetPropertyUint32(ctx, it->obj, idx);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return val;
        } else {
            JSValueConst args[2];
            JSValue num;
            num = JS_NewUint32(ctx, idx);
            args[0] = num;
            args[1] = val;
            obj = js_create_array(ctx, 2, args);
            JS_FreeValue(ctx, val);
            JS_FreeValue(ctx, num);
            return obj;
        }
    }
}